

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O2

DateFmtBestPattern * __thiscall
icu_63::DateFmtBestPatternKey::createObject
          (DateFmtBestPatternKey *this,void *param_1,UErrorCode *status)

{
  DateTimePatternGenerator *this_00;
  DateFmtBestPattern *this_01;
  UErrorCode *size;
  UnicodeString local_60;
  
  size = status;
  this_00 = DateTimePatternGenerator::createInstance
                      (&(this->super_LocaleCacheKey<icu_63::DateFmtBestPattern>).fLoc,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    this_01 = (DateFmtBestPattern *)UMemory::operator_new((UMemory *)0x58,(size_t)size);
    if (this_01 != (DateFmtBestPattern *)0x0) {
      DateTimePatternGenerator::getBestPattern(&local_60,this_00,&this->fSkeleton,status);
      DateFmtBestPattern::DateFmtBestPattern(this_01,&local_60);
    }
    if (*status < U_ILLEGAL_ARGUMENT_ERROR && this_01 == (DateFmtBestPattern *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else if (this_01 == (DateFmtBestPattern *)0x0) {
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_002bd898;
    }
    else {
      icu_63::UnicodeString::~UnicodeString(&local_60);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
LAB_002bd898:
        SharedObject::addRef((SharedObject *)this_01);
        goto LAB_002bd877;
      }
      (*(this_01->super_SharedObject).super_UObject._vptr_UObject[1])(this_01);
    }
  }
  this_01 = (DateFmtBestPattern *)0x0;
LAB_002bd877:
  if (this_00 != (DateTimePatternGenerator *)0x0) {
    (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
  }
  return this_01;
}

Assistant:

virtual const DateFmtBestPattern *createObject(
            const void * /*unused*/, UErrorCode &status) const {
        LocalPointer<DateTimePatternGenerator> dtpg(
                    DateTimePatternGenerator::createInstance(fLoc, status));
        if (U_FAILURE(status)) {
            return NULL;
        }
  
        LocalPointer<DateFmtBestPattern> pattern(
                new DateFmtBestPattern(
                        dtpg->getBestPattern(fSkeleton, status)),
                status);
        if (U_FAILURE(status)) {
            return NULL;
        }
        DateFmtBestPattern *result = pattern.orphan();
        result->addRef();
        return result;
    }